

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O1

QByteArray * __thiscall Moc::toFullyQualified(Moc *this,QByteArray *name)

{
  Span *pSVar1;
  ulong uVar2;
  const_iterator cVar3;
  
  cVar3 = QHash<QByteArray,_QByteArray>::constFindImpl<QByteArray>(&this->knownQObjectClasses,name);
  if (cVar3.i.d == (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0 && cVar3.i.bucket == 0)
  {
    cVar3 = QHash<QByteArray,_QByteArray>::constFindImpl<QByteArray>(&this->knownGadgets,name);
    if (cVar3.i.d != (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0 || cVar3.i.bucket != 0
       ) {
      pSVar1 = (cVar3.i.d)->spans;
      uVar2 = cVar3.i.bucket >> 7;
      name = (QByteArray *)
             (((pSVar1[uVar2].entries)->storage).data +
             (ulong)((uint)pSVar1[uVar2].offsets[(uint)cVar3.i.bucket & 0x7f] * 0x30) + 0x18);
    }
  }
  else {
    pSVar1 = (cVar3.i.d)->spans;
    uVar2 = cVar3.i.bucket >> 7;
    name = (QByteArray *)
           (((pSVar1[uVar2].entries)->storage).data +
           (ulong)((uint)pSVar1[uVar2].offsets[(uint)cVar3.i.bucket & 0x7f] * 0x30) + 0x18);
  }
  return name;
}

Assistant:

const QByteArray &Moc::toFullyQualified(const QByteArray &name) const noexcept
{
    if (auto it = knownQObjectClasses.find(name); it != knownQObjectClasses.end())
        return it.value();
    if (auto it = knownGadgets.find(name); it != knownGadgets.end())
        return it.value();
    return name;
}